

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yacclab_tests.cc
# Opt level: O2

bool __thiscall
YacclabTests::SaveBroadOutputResults
          (YacclabTests *this,Mat1d *results,string *o_filename,Mat1i *labels,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *filenames,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ccl_algorithms)

{
  pointer pbVar1;
  pointer ppVar2;
  char cVar3;
  ostream *poVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  uint uVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *algo_name;
  pointer pbVar7;
  uint i;
  ofstream os;
  
  std::ofstream::ofstream(&os,(string *)o_filename,_S_out);
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    std::operator<<((ostream *)&os,"#");
    pbVar1 = (ccl_algorithms->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar7 = (ccl_algorithms->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1)
    {
      poVar4 = std::operator<<((ostream *)&os,'\t');
      std::operator<<(poVar4,(string *)pbVar7);
    }
    std::operator<<((ostream *)&os,'\n');
    uVar5 = 0;
    while( true ) {
      uVar6 = (ulong)uVar5;
      ppVar2 = (filenames->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(filenames->
                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) / 0x28) <=
          uVar6) break;
      if (ppVar2[uVar6].second == true) {
        poVar4 = std::operator<<((ostream *)&os,(string *)(ppVar2 + uVar6));
        std::operator<<(poVar4,'\t');
        for (uVar6 = 0;
            uVar6 < (ulong)((long)(ccl_algorithms->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(ccl_algorithms->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 5);
            uVar6 = (ulong)((int)uVar6 + 1)) {
          poVar4 = std::ostream::_M_insert<double>
                             (*(double *)
                               (**(long **)&results->field_0x48 * (long)(int)uVar5 +
                                *(long *)&results->field_0x10 + (long)(int)uVar6 * 8));
          std::operator<<(poVar4,'\t');
        }
        std::operator<<((ostream *)&os,'\n');
      }
      uVar5 = uVar5 + 1;
    }
  }
  std::ofstream::~ofstream(&os);
  return (bool)cVar3;
}

Assistant:

bool YacclabTests::SaveBroadOutputResults(const cv::Mat1d& results, const std::string& o_filename, const cv::Mat1i& labels,
    const std::vector<std::pair<std::string, bool>>& filenames, const std::vector<std::string>& ccl_algorithms) {
    std::ofstream os(o_filename);
    if (!os.is_open()) {
        return false;
    }

    // To set heading file format
    os << "#";
    for (const auto& algo_name : ccl_algorithms) {
        os << '\t' << algo_name;
    }
    os << '\n';
    // To set heading file format

    for (unsigned files = 0; files < filenames.size(); ++files) {
        if (filenames[files].second) {
            os << filenames[files].first << '\t';
            for (unsigned i = 0; i < ccl_algorithms.size(); ++i) {
                os << results(files, i) << '\t';

            }
            os << '\n';
        }
    }
    return true;
}